

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_decoder.hpp
# Opt level: O2

uint8_t duckdb::RleBpDecoder::ComputeBitWidth(idx_t val)

{
  byte bVar1;
  
  bVar1 = 0;
  if (val != 0) {
    do {
      bVar1 = bVar1 + 1;
    } while (val >> (bVar1 & 0x3f) != 0);
  }
  return bVar1;
}

Assistant:

static uint8_t ComputeBitWidth(idx_t val) {
		if (val == 0) {
			return 0;
		}
		uint8_t ret = 1;
		while ((((idx_t)1u << (idx_t)ret) - 1) < val) {
			ret++;
		}
		return ret;
	}